

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O3

void Nf_ManElaBestMatchOne
               (Nf_Man_t *p,int iObj,int c,int *pCut,int *pCutSet,Nf_Mat_t *pRes,int Required)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  Nf_Obj_t *pNVar4;
  uint uVar5;
  word wVar6;
  byte bVar7;
  ulong uVar8;
  Nf_Mat_t *pMb;
  uint uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  float fVar15;
  Nf_Obj_t *pBestF [6];
  Nf_Mat_t local_b8;
  uint local_a4;
  Nf_Mat_t *local_a0;
  uint local_94;
  Nf_Man_t *local_90;
  int local_84;
  int *local_80;
  int *local_78;
  ulong local_70;
  long alStack_68 [7];
  
  uVar5 = *pCut;
  local_a4 = c;
  local_a0 = pRes;
  local_90 = p;
  local_84 = iObj;
  if (p->vTt2Match->nSize <= (int)(uVar5 >> 6)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  uVar9 = uVar5 & 0x1f;
  local_94 = uVar5 >> 5;
  if (uVar9 != 0) {
    uVar10 = (uVar5 >> 6) << 4;
    pVVar3 = p->vTt2Match->pArray;
    pNVar4 = p->pNfObjs;
    uVar8 = 0;
    do {
      alStack_68[uVar8] = (long)(pNVar4 + pCut[uVar8 + 1]);
      uVar8 = uVar8 + 1;
    } while (uVar9 != uVar8);
    local_b8._0_8_ = 0;
    local_b8.D = 0;
    local_b8.F = 0.0;
    if (uVar9 != 0) {
      if (*(int *)((long)&pVVar3->nSize + (ulong)uVar10) < 2) {
        return;
      }
      local_70 = (ulong)(((int)pCut - (int)pCutSet & 0xffcU) << 0x12);
      lVar13 = 0;
      local_80 = pCut;
      local_78 = pCutSet;
      do {
        lVar12 = *(long *)((long)&pVVar3->pArray + (ulong)uVar10);
        iVar1 = *(int *)(lVar12 + lVar13 * 4);
        uVar5 = *(uint *)&local_90->pCells[iVar1].field_0x10;
        if (uVar9 != uVar5 >> 0x1c) {
          __assert_fail("nFans == (int)pC->nFanins",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                        ,0x708,
                        "void Nf_ManElaBestMatchOne(Nf_Man_t *, int, int, int *, int *, Nf_Mat_t *, int)"
                       );
        }
        uVar2 = *(uint *)(lVar12 + 4 + lVar13 * 4);
        if (((uVar2 ^ local_94) & 1) == local_a4) {
          bVar7 = 0;
          uVar8 = 0;
          iVar14 = 0;
          do {
            lVar12 = (ulong)(((uVar2 >> 1 & 0x7f) >> ((uint)uVar8 & 0x1f) & 1) != 0) * 0x20;
            if (-1 < *(int *)(alStack_68[(uVar2 >> 8) >> (bVar7 & 0x1f) & 0xf] + lVar12)) {
              __assert_fail("pMd->fBest",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                            ,0x70e,
                            "void Nf_ManElaBestMatchOne(Nf_Man_t *, int, int, int *, int *, Nf_Mat_t *, int)"
                           );
            }
            iVar11 = local_90->pCells[iVar1].iDelays[uVar8] +
                     *(int *)(alStack_68[(uVar2 >> 8) >> (bVar7 & 0x1f) & 0xf] + lVar12 + 8);
            if (iVar14 <= iVar11) {
              iVar14 = iVar11;
            }
            if (Required < iVar14) goto LAB_00792bad;
            uVar8 = uVar8 + 1;
            bVar7 = bVar7 + 4;
          } while (uVar9 != uVar8);
          local_b8.F = 3.4028235e+38;
          local_b8.D = iVar14;
          if (local_80 <= local_78) goto LAB_00792ce3;
          local_b8._0_8_ =
               CONCAT44(uVar2,(uVar5 & 0xfffff) + (int)local_70 + -0x80000000) & 0xfffffffeffffffff;
          wVar6 = Nf_MatchRefArea(local_90,local_84,local_a4,&local_b8,Required);
          fVar15 = (float)(int)wVar6 / 1000.0;
          local_b8.F = fVar15;
          if ((fVar15 + 0.001 < local_a0->F) ||
             ((fVar15 + -0.001 < local_a0->F && (iVar14 < local_a0->D)))) {
            *(undefined4 *)&local_a0->field_0x0 = local_b8._0_4_;
            local_a0->Cfg = local_b8.Cfg;
            local_a0->D = local_b8.D;
            local_a0->F = fVar15;
          }
        }
LAB_00792bad:
        lVar13 = lVar13 + 2;
        if (*(int *)((long)&pVVar3->nSize + (ulong)uVar10) <= (int)((uint)lVar13 | 1)) {
          return;
        }
      } while( true );
    }
  }
  local_b8.D = 0;
  local_b8.F = 0.0;
  if (0x3f < uVar5) {
    __assert_fail("iFuncLit == 0 || iFuncLit == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                  ,0x6f4,
                  "void Nf_ManElaBestMatchOne(Nf_Man_t *, int, int, int *, int *, Nf_Mat_t *, int)")
    ;
  }
  uVar5 = (uint)(local_94 == 1) ^ c;
  fVar15 = p->pCells[(int)uVar5].AreaF;
  local_b8._8_8_ = (ulong)(uint)fVar15 << 0x20;
  if (pCutSet < pCut) {
    if ((fVar15 + 0.001 < pRes->F) || ((fVar15 + -0.001 < pRes->F && (0 < pRes->D)))) {
      *(uint *)pRes =
           (uVar5 & 0xfffff) + ((int)pCut - (int)pCutSet & 0xffcU) * 0x40000 + -0x80000000;
      pRes->Cfg = (Nf_Cfg_t)0x0;
      pRes->D = local_b8.D;
      pRes->F = local_b8.F;
    }
    return;
  }
LAB_00792ce3:
  __assert_fail("pCut > pCutSet",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                ,0x93,"int Nf_CutHandle(int *, int *)");
}

Assistant:

void Nf_ManElaBestMatchOne( Nf_Man_t * p, int iObj, int c, int * pCut, int * pCutSet, Nf_Mat_t * pRes, int Required )
{
    Nf_Mat_t Mb,*pMb = &Mb, * pMd;
    int * pFans      = Nf_CutLeaves(pCut);
    int nFans        = Nf_CutSize(pCut);
    int iFuncLit     = Nf_CutFunc(pCut);
    int fComplExt    = Abc_LitIsCompl(iFuncLit);
    Vec_Int_t * vArr = Vec_WecEntry( p->vTt2Match, Abc_Lit2Var(iFuncLit) );
    int i, k, Info, Offset, iFanin, fComplF;
    // assign fanins matches
    Nf_Obj_t * pBestF[NF_LEAF_MAX];
    for ( i = 0; i < nFans; i++ )
        pBestF[i] = Nf_ManObj( p, pFans[i] );
    // consider matches of this function
    memset( pMb, 0, sizeof(Nf_Mat_t) );
    pMb->D = SCL_INFINITY; pMb->F = FLT_MAX;
    // special cases
    if ( nFans == 0 )
    {
        int Const = (iFuncLit == 1);
        //printf( "Node %d(%d) is const\n", iObj, c );
        assert( iFuncLit == 0 || iFuncLit == 1 );
        pMb->D = 0;
        pMb->F = p->pCells[c ^ Const].AreaF;
        pMb->CutH = Nf_CutHandle(pCutSet, pCut);
        pMb->Gate = c ^ Const;
//        pMb->Conf = 0;
        pMb->Cfg = Nf_Int2Cfg(0);
        pMb->fBest = 1;
        // compare
        if ( pRes->F > pMb->F + NF_EPSILON || (pRes->F > pMb->F - NF_EPSILON && pRes->D > pMb->D) )
            *pRes = *pMb;
        return;
    }
    // consider matches of this function
    Vec_IntForEachEntryDouble( vArr, Info, Offset, i )
    {
        Nf_Cfg_t Cfg   = Nf_Int2Cfg(Offset);
        Mio_Cell2_t*pC = Nf_ManCell( p, Info );
        int fCompl     = Cfg.fCompl ^ fComplExt;
        int Delay      = 0;
        assert( nFans == (int)pC->nFanins );
        if ( fCompl != c )
            continue;
        Nf_CfgForEachVarCompl( Cfg, nFans, iFanin, fComplF, k )
        {
            pMd     = &pBestF[iFanin]->M[fComplF][0];
            assert( pMd->fBest );
            Delay = Abc_MaxInt( Delay, pMd->D + pC->iDelays[k] );
            if ( Delay > Required )
                break;
        }
        if ( k < nFans )
            continue;
        // create match
        pMb->D = Delay;
        pMb->F = FLT_MAX;
        pMb->fBest = 1;
        pMb->fCompl = 0;
        pMb->CutH = Nf_CutHandle(pCutSet, pCut);
        pMb->Gate = pC->Id;
        pMb->Cfg = Cfg;
        pMb->Cfg.fCompl = 0;
        // compute area
        pMb->F = Scl_Int2Flt((int)Nf_MatchRefArea(p, iObj, c, pMb, Required));
        // compare
        if ( pRes->F > pMb->F + NF_EPSILON || (pRes->F > pMb->F - NF_EPSILON && pRes->D > pMb->D) )
            *pRes = *pMb;
    }
}